

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

int JS_ObjectDefineProperties(JSContext *ctx,JSValue obj,JSValue properties)

{
  JSValue obj_00;
  JSPropertyEnum *pJVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  JSContext *pJVar5;
  JSValue v;
  JSValue JVar6;
  JSValue this_obj;
  uint32_t len;
  JSPropertyEnum *atoms;
  uint local_74;
  JSContext *local_70;
  int64_t local_68;
  JSValueUnion local_60;
  JSPropertyEnum *local_58;
  ulong local_50;
  JSValueUnion local_48;
  JSValueUnion local_40;
  int64_t local_38;
  
  local_38 = obj.tag;
  local_40 = obj.u;
  if ((int)obj.tag == -1) {
    JVar6 = JS_ToObject(ctx,properties);
    local_68 = JVar6.tag;
    local_60 = JVar6.u;
    iVar2 = -1;
    if ((int)JVar6.tag != 6) {
      iVar2 = JS_GetOwnPropertyNamesInternal(ctx,&local_58,&local_74,(JSObject *)local_60.ptr,0x13);
      pJVar1 = local_58;
      JVar6 = (JSValue)(ZEXT816(3) << 0x40);
      pJVar5 = ctx;
      if (iVar2 < 0) {
        iVar2 = -1;
      }
      else {
        local_50 = (ulong)local_74;
        if (local_50 == 0) {
          iVar2 = 0;
          JVar6 = (JSValue)(ZEXT816(3) << 0x40);
        }
        else {
          local_48.float64 = local_60.float64;
          uVar4 = 0;
          JVar6 = (JSValue)(ZEXT816(3) << 0x40);
          iVar2 = -1;
          local_70 = ctx;
          do {
            if ((0xfffffff4 < (uint)JVar6.tag) &&
               (iVar3 = *JVar6.u.ptr, *(int *)JVar6.u.ptr = iVar3 + -1, iVar3 < 2)) {
              __JS_FreeValueRT(local_70->rt,JVar6);
            }
            JVar6.tag = local_68;
            JVar6.u.ptr = local_48.ptr;
            this_obj.tag = local_68;
            this_obj.u.ptr = local_48.ptr;
            JVar6 = JS_GetPropertyInternal(ctx,JVar6,pJVar1[uVar4].atom,this_obj,0);
            pJVar5 = local_70;
            if (((int)JVar6.tag == 6) ||
               (obj_00.tag = local_38, obj_00.u.float64 = local_40.float64,
               iVar3 = JS_DefinePropertyDesc(ctx,obj_00,pJVar1[uVar4].atom,JVar6,0x4000),
               pJVar5 = local_70, iVar3 < 0)) goto LAB_001633dd;
            uVar4 = uVar4 + 1;
          } while (local_50 != uVar4);
          iVar2 = 0;
        }
      }
LAB_001633dd:
      js_free_prop_enum(pJVar5,local_58,local_74);
      if ((0xfffffff4 < (uint)local_68) &&
         (iVar3 = *local_60.ptr, *(int *)local_60.ptr = iVar3 + -1, iVar3 < 2)) {
        v.tag = local_68;
        v.u.ptr = local_60.ptr;
        __JS_FreeValueRT(pJVar5->rt,v);
      }
      if ((0xfffffff4 < (uint)JVar6.tag) &&
         (iVar3 = *JVar6.u.ptr, *(int *)JVar6.u.ptr = iVar3 + -1, iVar3 < 2)) {
        __JS_FreeValueRT(pJVar5->rt,JVar6);
      }
    }
  }
  else {
    JS_ThrowTypeError(ctx,"not an object");
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

static __exception int JS_ObjectDefineProperties(JSContext *ctx,
                                                 JSValueConst obj,
                                                 JSValueConst properties)
{
    JSValue props, desc;
    JSObject *p;
    JSPropertyEnum *atoms;
    uint32_t len, i;
    int ret = -1;

    if (!JS_IsObject(obj)) {
        JS_ThrowTypeErrorNotAnObject(ctx);
        return -1;
    }
    desc = JS_UNDEFINED;
    props = JS_ToObject(ctx, properties);
    if (JS_IsException(props))
        return -1;
    p = JS_VALUE_GET_OBJ(props);
    if (JS_GetOwnPropertyNamesInternal(ctx, &atoms, &len, p, JS_GPN_ENUM_ONLY | JS_GPN_STRING_MASK | JS_GPN_SYMBOL_MASK) < 0)
        goto exception;
    for(i = 0; i < len; i++) {
        JS_FreeValue(ctx, desc);
        desc = JS_GetProperty(ctx, props, atoms[i].atom);
        if (JS_IsException(desc))
            goto exception;
        if (JS_DefinePropertyDesc(ctx, obj, atoms[i].atom, desc, JS_PROP_THROW) < 0)
            goto exception;
    }
    ret = 0;

exception:
    js_free_prop_enum(ctx, atoms, len);
    JS_FreeValue(ctx, props);
    JS_FreeValue(ctx, desc);
    return ret;
}